

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkCallNullable(CheckerVisitor *this,CallExpr *call)

{
  bool bVar1;
  TreeOp TVar2;
  Node *this_00;
  Id *this_01;
  CallExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *in_stack_00000018;
  Expr *c;
  char *local_30;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    this_00 = &CallExpr::callee(in_RSI)->super_Node;
    bVar1 = CallExpr::isNullable(in_RSI);
    if ((!bVar1) && (bVar1 = isPotentiallyNullable((CheckerVisitor *)c,in_stack_00000018), bVar1)) {
      TVar2 = Node::op(this_00);
      if (TVar2 == TO_ID) {
        this_01 = Node::asId(this_00);
        local_30 = Id::id(this_01);
      }
      else {
        local_30 = "expression";
      }
      report(in_RDI,this_00,0x5f,local_30,"function");
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCallNullable(const CallExpr *call) {
  if (effectsOnly)
    return;

  const Expr *c = call->callee();

  if (!call->isNullable() && isPotentiallyNullable(c)) {
    report(c, DiagnosticsId::DI_ACCESS_POT_NULLABLE, c->op() == TO_ID ? c->asId()->id() : "expression", "function");
  }
}